

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall
cmComputeLinkInformation::AddSharedDepItem(cmComputeLinkInformation *this,LinkEntry *entry)

{
  bool bVar1;
  TargetType TVar2;
  ulong uVar3;
  char *local_108;
  char *soname;
  string soName;
  cmOrderDirectories *order;
  ArtifactType local_7c;
  undefined1 local_78 [4];
  ArtifactType artifact;
  string lib;
  undefined1 local_48 [8];
  string file;
  cmGeneratorTarget *tgt;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *item;
  LinkEntry *entry_local;
  cmComputeLinkInformation *this_local;
  
  file.field_2._8_8_ = entry->Target;
  if (((((cmGeneratorTarget *)file.field_2._8_8_ != (cmGeneratorTarget *)0x0) &&
       (TVar2 = cmGeneratorTarget::GetType((cmGeneratorTarget *)file.field_2._8_8_),
       TVar2 == SHARED_LIBRARY)) && (bVar1 = cmGeneratorTarget::IsDLLPlatform(this->Target), bVar1))
     && (this->SharedDependencyMode != SharedDepModeLink)) {
    AddRuntimeDLL(this,(cmGeneratorTarget *)file.field_2._8_8_);
  }
  if (this->SharedDependencyMode == SharedDepModeNone) {
    return;
  }
  if (file.field_2._8_8_ == 0) {
    bVar1 = cmsys::SystemTools::FileIsFullPath((string *)entry);
    if (!bVar1) {
      return;
    }
    cmsys::SystemTools::GetFilenameName((string *)local_48,(string *)entry);
    bVar1 = cmsys::RegularExpression::find(&this->ExtractSharedLibraryName,(string *)local_48);
    lib.field_2._9_3_ = 0;
    lib.field_2._M_local_buf[8] = !bVar1;
    std::__cxx11::string::~string((string *)local_48);
    if (lib.field_2._8_4_ != 0) {
      return;
    }
  }
  else {
    TVar2 = cmGeneratorTarget::GetType((cmGeneratorTarget *)file.field_2._8_8_);
    if (TVar2 != SHARED_LIBRARY) {
      return;
    }
  }
  if (this->SharedDependencyMode == SharedDepModeLink) {
    AddItem(this,entry);
  }
  else {
    std::__cxx11::string::string((string *)local_78);
    if (file.field_2._8_8_ == 0) {
      std::__cxx11::string::operator=((string *)local_78,(string *)entry);
      AddLibraryRuntimeInfo(this,(string *)local_78);
    }
    else {
      bVar1 = cmGeneratorTarget::HasImportLibrary
                        ((cmGeneratorTarget *)file.field_2._8_8_,&this->Config);
      local_7c = (ArtifactType)bVar1;
      cmGeneratorTarget::GetFullPath
                ((string *)&order,(cmGeneratorTarget *)file.field_2._8_8_,&this->Config,local_7c,
                 false);
      std::__cxx11::string::operator=((string *)local_78,(string *)&order);
      std::__cxx11::string::~string((string *)&order);
      AddLibraryRuntimeInfo(this,(string *)local_78,(cmGeneratorTarget *)file.field_2._8_8_);
    }
    soName.field_2._8_8_ = 0;
    if ((this->SharedDependencyMode == SharedDepModeLibDir) &&
       ((this->LinkWithRuntimePath & 1U) == 0)) {
      soName.field_2._8_8_ =
           std::unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::get
                     (&this->OrderLinkerSearchPath);
    }
    else if (this->SharedDependencyMode == SharedDepModeDir) {
      soName.field_2._8_8_ =
           std::unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::get
                     (&this->OrderDependentRPath);
    }
    if (soName.field_2._8_8_ != 0) {
      if (file.field_2._8_8_ == 0) {
        cmOrderDirectories::AddRuntimeLibrary
                  ((cmOrderDirectories *)soName.field_2._8_8_,(string *)local_78,(char *)0x0);
      }
      else {
        cmGeneratorTarget::GetSOName
                  ((string *)&soname,(cmGeneratorTarget *)file.field_2._8_8_,&this->Config);
        uVar3 = std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          local_108 = (char *)std::__cxx11::string::c_str();
        }
        else {
          local_108 = (char *)0x0;
        }
        cmOrderDirectories::AddRuntimeLibrary
                  ((cmOrderDirectories *)soName.field_2._8_8_,(string *)local_78,local_108);
        std::__cxx11::string::~string((string *)&soname);
      }
    }
    std::__cxx11::string::~string((string *)local_78);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddSharedDepItem(LinkEntry const& entry)
{
  BT<std::string> const& item = entry.Item;
  const cmGeneratorTarget* tgt = entry.Target;

  // Record dependencies on DLLs.
  if (tgt && tgt->GetType() == cmStateEnums::SHARED_LIBRARY &&
      this->Target->IsDLLPlatform() &&
      this->SharedDependencyMode != SharedDepModeLink) {
    this->AddRuntimeDLL(tgt);
  }

  // If dropping shared library dependencies, ignore them.
  if (this->SharedDependencyMode == SharedDepModeNone) {
    return;
  }

  // The user may have incorrectly named an item.  Skip items that are
  // not full paths to shared libraries.
  if (tgt) {
    // The target will provide a full path.  Make sure it is a shared
    // library.
    if (tgt->GetType() != cmStateEnums::SHARED_LIBRARY) {
      return;
    }
  } else {
    // Skip items that are not full paths.  We will not be able to
    // reliably specify them.
    if (!cmSystemTools::FileIsFullPath(item.Value)) {
      return;
    }

    // Get the name of the library from the file name.
    std::string file = cmSystemTools::GetFilenameName(item.Value);
    if (!this->ExtractSharedLibraryName.find(file)) {
      // This is not the name of a shared library.
      return;
    }
  }

  // If in linking mode, just link to the shared library.
  if (this->SharedDependencyMode == SharedDepModeLink) {
    this->AddItem(entry);
    return;
  }

  // Get a full path to the dependent shared library.
  // Add it to the runtime path computation so that the target being
  // linked will be able to find it.
  std::string lib;
  if (tgt) {
    cmStateEnums::ArtifactType artifact = tgt->HasImportLibrary(this->Config)
      ? cmStateEnums::ImportLibraryArtifact
      : cmStateEnums::RuntimeBinaryArtifact;
    lib = tgt->GetFullPath(this->Config, artifact);
    this->AddLibraryRuntimeInfo(lib, tgt);
  } else {
    lib = item.Value;
    this->AddLibraryRuntimeInfo(lib);
  }

  // Check if we need to include the dependent shared library in other
  // path ordering.
  cmOrderDirectories* order = nullptr;
  if (this->SharedDependencyMode == SharedDepModeLibDir &&
      !this->LinkWithRuntimePath /* AddLibraryRuntimeInfo adds it */) {
    // Add the item to the linker search path.
    order = this->OrderLinkerSearchPath.get();
  } else if (this->SharedDependencyMode == SharedDepModeDir) {
    // Add the item to the separate dependent library search path.
    order = this->OrderDependentRPath.get();
  }
  if (order) {
    if (tgt) {
      std::string soName = tgt->GetSOName(this->Config);
      const char* soname = soName.empty() ? nullptr : soName.c_str();
      order->AddRuntimeLibrary(lib, soname);
    } else {
      order->AddRuntimeLibrary(lib);
    }
  }
}